

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O2

void __thiscall resetOnEndTimeFixture::~resetOnEndTimeFixture(resetOnEndTimeFixture *this)

{
  anon_unknown.dwarf_334836::sessionFixture::~sessionFixture((sessionFixture *)this);
  operator_delete(this,0x640);
  return;
}

Assistant:

void createSession() {
    now.setCurrent();
    startTimeStamp = now;
    startTimeStamp.setMillisecond(0);

    endTimeStamp = startTimeStamp;

    startTime = UtcTimeOnly(startTimeStamp);
    endTime = UtcTimeOnly(endTimeStamp);
    endTime += 2;

    acceptorFixture::createSession(0);
  }